

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

bool __thiscall LLVMBC::ModuleParseContext::resolve_forward_references(ModuleParseContext *this)

{
  pointer ppVVar1;
  pointer ppBVar2;
  BasicBlock *this_00;
  bool bVar3;
  bool bVar4;
  __normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>
  _Var5;
  __normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>
  _Var6;
  pointer ppBVar7;
  pointer ppVVar8;
  bool bVar9;
  
  ppVVar8 = (this->pending_forward_references).
            super__Vector_base<LLVMBC::ValueProxy_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::ValueProxy_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVVar1 = (this->pending_forward_references).
            super__Vector_base<LLVMBC::ValueProxy_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::ValueProxy_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  bVar9 = ppVVar8 == ppVVar1;
  if (!bVar9) {
    bVar3 = ValueProxy::resolve(*ppVVar8);
    if (bVar3) {
      do {
        ppVVar8 = ppVVar8 + 1;
        bVar9 = ppVVar8 == ppVVar1;
        if (bVar9) goto LAB_0018813d;
        bVar3 = ValueProxy::resolve(*ppVVar8);
      } while (bVar3);
    }
    if (!bVar9) {
      return false;
    }
  }
LAB_0018813d:
  ppVVar8 = (this->pending_forward_references).
            super__Vector_base<LLVMBC::ValueProxy_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::ValueProxy_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->pending_forward_references).
      super__Vector_base<LLVMBC::ValueProxy_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::ValueProxy_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVVar8) {
    (this->pending_forward_references).
    super__Vector_base<LLVMBC::ValueProxy_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::ValueProxy_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVVar8;
  }
  ppBVar7 = (this->basic_blocks).
            super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppBVar2 = (this->basic_blocks).
            super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar9 = ppBVar7 == ppBVar2;
    if (bVar9) {
      return bVar9;
    }
    this_00 = *ppBVar7;
    _Var5._M_current = (Instruction **)BasicBlock::begin(this_00);
    _Var6._M_current = (Instruction **)BasicBlock::end(this_00);
    bVar3 = _Var5._M_current == _Var6._M_current;
    if (!bVar3) {
      bVar4 = Instruction::resolve_proxy_values(*_Var5._M_current);
      if (bVar4) {
        do {
          _Var5._M_current = _Var5._M_current + 1;
          bVar3 = _Var5._M_current == _Var6._M_current;
          if (bVar3) goto LAB_001881b5;
          bVar4 = Instruction::resolve_proxy_values(*_Var5._M_current);
        } while (bVar4);
      }
      if (!bVar3) {
        return bVar9;
      }
    }
LAB_001881b5:
    ppBVar7 = ppBVar7 + 1;
  } while( true );
}

Assistant:

bool ModuleParseContext::resolve_forward_references()
{
	for (auto *ref : pending_forward_references)
		if (!ref->resolve())
			return false;
	pending_forward_references.clear();

	for (auto *bb : basic_blocks)
		for (auto &inst : *bb)
			if (!inst.resolve_proxy_values())
				return false;

	return true;
}